

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sastoken.c
# Opt level: O0

double getExpiryValue(char *expiryASCII)

{
  long local_20;
  size_t i;
  double value;
  char *expiryASCII_local;
  
  i = 0;
  local_20 = 0;
  while( true ) {
    if (expiryASCII[local_20] == '\0') {
      return (double)i;
    }
    if ((expiryASCII[local_20] < '0') || ('9' < expiryASCII[local_20])) break;
    i = (size_t)((double)i * 10.0 + ((double)(int)expiryASCII[local_20] - 48.0));
    local_20 = local_20 + 1;
  }
  return 0.0;
}

Assistant:

static double getExpiryValue(const char* expiryASCII)
{
    double value = 0;
    size_t i = 0;
    for (i = 0; expiryASCII[i] != '\0'; i++)
    {
        if (expiryASCII[i] >= '0' && expiryASCII[i] <= '9')
        {
            value = value * 10.0 + ((double)expiryASCII[i] - (double)'0');
        }
        else
        {
            value = 0;
            break;
        }
    }
    return value;
}